

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeOpenTypeWrapper.cpp
# Opt level: O0

EFontStretch __thiscall
FreeTypeOpenTypeWrapper::GetFontStretchForPCLTValue
          (FreeTypeOpenTypeWrapper *this,FT_Char inWidthValue)

{
  undefined4 local_1c;
  undefined4 local_18;
  FT_Char inWidthValue_local;
  FreeTypeOpenTypeWrapper *this_local;
  
  if (inWidthValue == '\x05') {
    local_18 = eFontStretchUltraExpanded;
  }
  else {
    if (inWidthValue == -5) {
      local_1c = eFontStretchUltraCondensed;
    }
    else {
      local_1c = (int)inWidthValue + eFontStretchNormal;
    }
    local_18 = local_1c;
  }
  return local_18;
}

Assistant:

EFontStretch FreeTypeOpenTypeWrapper::GetFontStretchForPCLTValue(FT_Char inWidthValue)
{
	return 
		(5 == inWidthValue) ? 
			eFontStretchUltraExpanded : 
			(-5 == inWidthValue) ?
			eFontStretchUltraCondensed :
			EFontStretch(eFontStretchNormal + inWidthValue);

	// mapping edges to extremes, the rest is linear
}